

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int ssa_dead_insn_p(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  MIR_insn_t pMVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int op_num;
  bb_insn_t_conflict local_60;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  
  pMVar1 = bb_insn->insn;
  iVar2 = 0;
  iVar5 = (int)*(ulong *)&pMVar1->field_0x18;
  if ((((iVar5 - 0xaaU < 0xfffffffd) &&
       ((uVar4 = iVar5 - 0xad, 5 < uVar4 || ((0x2bU >> (uVar4 & 0x1f) & 1) == 0)))) &&
      ((iter.nops = *(ulong *)&pMVar1->field_0x18 >> 0x20, iter.nops == 0 ||
       ((pMVar1->ops[0].field_0x8 != '\x02' || ((pMVar1->ops[0].u.reg & 0xfffffffe) != 4)))))) &&
     (bb_insn->bb->index != 0)) {
    iVar5 = 0;
    iter.op_num = 0;
    iter.op_part_num = 0;
    local_60 = bb_insn;
    iter.insn = pMVar1;
    while (iVar2 = output_insn_var_iterator_next(gen_ctx,&iter,&var,&op_num), iVar2 != 0) {
      if (pMVar1->ops[op_num].field_0x8 == '\v') {
        return 0;
      }
      iVar5 = 1;
      if (pMVar1->ops[op_num].data != (void *)0x0) {
        return 0;
      }
    }
    iVar2 = iVar5;
    if (0xfffffff7 < *(int *)&pMVar1->field_0x18 - 0x76U) {
      iVar3 = reachable_bo_exists_p((local_60->bb_insn_link).next);
      iVar2 = 0;
      if (iVar3 == 0) {
        iVar2 = iVar5;
      }
    }
  }
  return iVar2;
}

Assistant:

static int ssa_dead_insn_p (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  MIR_insn_t insn = bb_insn->insn;
  int op_num, output_exists_p = FALSE;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  ssa_edge_t ssa_edge;

  /* check control insns with possible output: */
  if (MIR_call_code_p (insn->code) || insn->code == MIR_ALLOCA || insn->code == MIR_BSTART
      || insn->code == MIR_VA_START || insn->code == MIR_VA_ARG
      || (insn->nops > 0 && insn->ops[0].mode == MIR_OP_VAR
          && (insn->ops[0].u.var == FP_HARD_REG || insn->ops[0].u.var == SP_HARD_REG)))
    return FALSE;
  if (fake_insn_p (bb_insn)) return FALSE;
  FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    output_exists_p = TRUE;
    if (insn->ops[op_num].mode == MIR_OP_VAR_MEM || (ssa_edge = insn->ops[op_num].data) != NULL)
      return FALSE;
  }
  if (!MIR_overflow_insn_code_p (insn->code)
      || !reachable_bo_exists_p (DLIST_NEXT (bb_insn_t, bb_insn)))
    return output_exists_p;
  return FALSE;
}